

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_reply(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  CHAR_DATA *ch_01;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  bool deaf;
  char buf [4608];
  CHAR_DATA *victim;
  int in_stack_000012a0;
  int in_stack_000012a4;
  void *in_stack_000012a8;
  void *in_stack_000012b0;
  CHAR_DATA *in_stack_000012b8;
  char *in_stack_000012c0;
  CHAR_DATA *in_stack_ffffffffffffed68;
  CHAR_DATA *in_stack_ffffffffffffed70;
  CHAR_DATA *in_stack_ffffffffffffed78;
  char *in_stack_ffffffffffffed80;
  ulong uVar6;
  CHAR_DATA *in_stack_ffffffffffffed88;
  CHAR_DATA *ch_02;
  char *in_stack_ffffffffffffed98;
  char *local_1258;
  char local_1234;
  char local_1218 [4480];
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *local_10;
  
  uVar6 = in_RDI->comm[0];
  _Var5 = std::pow<int,int>(0,0x5292fa);
  if ((uVar6 & (long)_Var5) == 0) {
    ch_00 = in_RDI->reply;
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
    }
    else if ((((ch_00->desc != (DESCRIPTOR_DATA *)0x0) ||
              (bVar1 = is_npc(in_stack_ffffffffffffed68), bVar1)) ||
             (bVar1 = is_switched(ch_00), bVar1)) || (ch_00->pcdata == (PC_DATA *)0x0)) {
      bVar1 = is_immortal(in_stack_ffffffffffffed68);
      if ((bVar1) ||
         ((bVar1 = is_awake(ch_00), bVar1 && (bVar1 = is_affected(ch_00,(int)gsn_deafen), !bVar1))))
      {
        uVar6 = ch_00->comm[0];
        _Var5 = std::pow<int,int>(0,0x529510);
        if (((((uVar6 & (long)_Var5) == 0) &&
             (uVar6 = ch_00->comm[0], _Var5 = std::pow<int,int>(0,0x529546),
             (uVar6 & (long)_Var5) == 0)) || (bVar1 = is_immortal(in_stack_ffffffffffffed68), bVar1)
            ) || (bVar1 = is_immortal(in_stack_ffffffffffffed68), bVar1)) {
          bVar1 = is_immortal(in_stack_ffffffffffffed68);
          if ((bVar1) || (bVar1 = is_awake(in_RDI), bVar1)) {
            bVar1 = is_affected(in_RDI,(int)gsn_imprisonvoice);
            if (bVar1) {
              send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
            }
            else {
              bVar1 = is_affected(in_RDI,(int)gsn_gag);
              if (bVar1) {
                send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
              }
              else {
                bVar1 = is_immortal(in_stack_ffffffffffffed68);
                if (!bVar1) {
                  check_ooc(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            in_stack_ffffffffffffff68);
                }
                bVar1 = is_affected(in_RDI,(int)gsn_deafen);
                local_10 = in_RSI;
                if (bVar1) {
                  upstring(in_RSI);
                  local_10 = palloc_string(in_stack_ffffffffffffed98);
                }
                bVar2 = is_immortal(in_stack_ffffffffffffed68);
                if ((!bVar2) || (bVar2 = is_npc(in_stack_ffffffffffffed68), bVar2)) {
                  local_1258 = "N";
                }
                else {
                  local_1258 = "F";
                }
                pcVar3 = get_char_color(in_stack_ffffffffffffed88,in_stack_ffffffffffffed80);
                pcVar4 = END_COLOR(in_stack_ffffffffffffed78);
                sprintf(local_1218,"You tell $%s \'%s$t%s\'",local_1258,pcVar3,pcVar4);
                act(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                    in_stack_ffffffffffffed68,0);
                bVar2 = is_immortal(in_stack_ffffffffffffed68);
                if ((!bVar2) || (bVar2 = is_npc(in_stack_ffffffffffffed68), bVar2)) {
                  ch_02 = (CHAR_DATA *)0x7b9d12;
                }
                else {
                  ch_02 = (CHAR_DATA *)0x83131a;
                }
                ch_01 = (CHAR_DATA *)get_char_color(ch_02,in_stack_ffffffffffffed80);
                pcVar3 = END_COLOR(ch_01);
                sprintf(local_1218,"$%s tells you \'%s$t%s\'",ch_02,ch_01,pcVar3);
                act_new(in_stack_000012c0,in_stack_000012b8,in_stack_000012b0,in_stack_000012a8,
                        in_stack_000012a4,in_stack_000012a0);
                uVar6 = ch_00->progtypes[0];
                _Var5 = std::pow<int,int>(0,0x529877);
                if (((uVar6 & (long)_Var5) != 0) && (ch_00 != in_RDI)) {
                  (*(code *)ch_00->pIndexData->mprogs->speech_prog)(ch_00,in_RDI,local_10);
                }
                ch_00->reply = in_RDI;
                if (bVar1) {
                  free_pstring((char *)ch_02);
                }
              }
            }
          }
          else {
            send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
          }
        }
        else {
          act_new(in_stack_000012c0,in_stack_000012b8,in_stack_000012b0,in_stack_000012a8,
                  in_stack_000012a4,in_stack_000012a0);
        }
      }
      else {
        act(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
            in_stack_ffffffffffffed68,0);
      }
    }
    else {
      act(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
          in_stack_ffffffffffffed68,0);
      pcVar3 = pers(in_stack_ffffffffffffed78,in_stack_ffffffffffffed70);
      sprintf(local_1218,"%s tells you \'%s\'\n\r",pcVar3,in_RSI);
      if ((local_1218[0] < 'a') || ('z' < local_1218[0])) {
        local_1234 = local_1218[0];
      }
      else {
        local_1234 = local_1218[0] + -0x20;
      }
      local_1218[0] = local_1234;
      add_buf((BUFFER *)in_stack_ffffffffffffed88,in_stack_ffffffffffffed80);
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
  }
  return;
}

Assistant:

void do_reply(CHAR_DATA *ch, char *argument)
{
	if (IS_SET(ch->comm, COMM_NOTELL))
	{
		send_to_char("Your message didn't get through.\n\r", ch);
		return;
	}

	auto victim = ch->reply;
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	char buf[MAX_STRING_LENGTH];
	if (victim->desc == nullptr && !is_npc(victim) && !is_switched(victim) && victim->pcdata)
	{
		act("$N seems to have lost consciousness...try again later.", ch, nullptr, victim, TO_CHAR);
		sprintf(buf, "%s tells you '%s'\n\r", pers(ch, victim), argument);
		buf[0] = UPPER(buf[0]);
		add_buf(victim->pcdata->buffer, buf);
		return;
	}

	if (!is_immortal(ch) && (!is_awake(victim) || is_affected(victim, gsn_deafen)))
	{
		act("$E can't hear you.", ch, 0, victim, TO_CHAR);
		return;
	}

	if ((IS_SET(victim->comm, COMM_QUIET) || IS_SET(victim->comm, COMM_DEAF)) && !is_immortal(ch) && !is_immortal(victim))
	{
		act_new("$E is not receiving tells.", ch, 0, victim, TO_CHAR, POS_DEAD);
		return;
	}

	if (!is_immortal(victim) && !is_awake(ch))
	{
		send_to_char("In your dreams, or what?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_imprisonvoice))
	{
		send_to_char("Your vocal cords are frozen solid!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_gag))
	{
		send_to_char("You are gagged and cannot speak!\n\r", ch);
		return;
	}

	if (!is_immortal(victim))
		check_ooc(ch, argument, "TELL");

	auto deaf = false;
	if (is_affected(ch, gsn_deafen))
	{
		deaf = true;
		argument = palloc_string(upstring(argument));
	}

	sprintf(buf, "You tell $%s '%s$t%s'",
			is_immortal(ch) && !is_npc(victim) ? "F" : "N",
			get_char_color(ch, "tells"),
			END_COLOR(ch));

	act(buf, ch, argument, victim, TO_CHAR);

	sprintf(buf, "$%s tells you '%s$t%s'",
			is_immortal(victim) && !is_npc(ch) ? "f" : "n",
			get_char_color(victim, "tells"),
			END_COLOR(victim));

	act_new(buf, ch, argument, victim, TO_VICT, POS_DEAD);

	if (IS_SET(victim->progtypes, MPROG_SPEECH) && victim != ch)
		victim->pIndexData->mprogs->speech_prog(victim, ch, argument);

	victim->reply = ch;

	if (deaf)
		free_pstring(argument);
}